

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

void __thiscall
lzham::lzcompressor::lzcompressor(lzcompressor *this,lzham_malloc_context malloc_context)

{
  long lVar1;
  
  this->m_malloc_context = malloc_context;
  init_params::init_params(&this->m_params);
  this->m_src_size = -1;
  this->m_src_adler32 = 0;
  search_accelerator::search_accelerator(&this->m_accel,malloc_context);
  lzham::symbol_codec::symbol_codec(&this->m_codec,malloc_context);
  coding_stats::coding_stats(&this->m_stats);
  (this->m_block_buf).m_p = (uchar *)0x0;
  (this->m_block_buf).m_size = 0;
  (this->m_block_buf).m_capacity = 0;
  (this->m_block_buf).m_malloc_context = malloc_context;
  (this->m_comp_buf).m_p = (uchar *)0x0;
  (this->m_comp_buf).m_size = 0;
  (this->m_comp_buf).m_capacity = 0;
  (this->m_comp_buf).m_malloc_context = malloc_context;
  this->m_step = 0;
  this->m_block_start_dict_ofs = 0;
  *(undefined8 *)((long)&this->m_block_start_dict_ofs + 3) = 0;
  state::state(&this->m_start_of_block_state,malloc_context);
  state::state(&this->m_state,malloc_context);
  this->m_fast_bytes = 0x80;
  this->m_num_parse_threads = 0;
  lVar1 = 0;
  do {
    raw_parse_thread_state::raw_parse_thread_state
              ((raw_parse_thread_state *)
               ((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_state.
                      super_state_base.m_match_hist + lVar1 + -0x10));
    lVar1 = lVar1 + 0x156800;
  } while (lVar1 != 0xc0a800);
  for (lVar1 = 0x43f0; lVar1 != 0xc0ebf0; lVar1 = lVar1 + 0x156800) {
    raw_parse_thread_state::set_malloc_context
              ((raw_parse_thread_state *)
               ((long)&(this->super_CLZBase).super_CLZDecompBase.m_dict_size_log2 + lVar1),
               malloc_context);
  }
  return;
}

Assistant:

lzcompressor::lzcompressor(lzham_malloc_context malloc_context) :
      m_malloc_context(malloc_context),
      m_src_size(-1),
      m_src_adler32(0),
      m_accel(malloc_context),
      m_codec(malloc_context),
      m_block_buf(malloc_context),
      m_comp_buf(malloc_context),
      m_step(0),
      m_block_start_dict_ofs(0),
      m_block_index(0),
      m_finished(false),
      m_use_task_pool(false),
      m_use_extreme_parsing(false),
      m_start_of_block_state(malloc_context),
      m_state(malloc_context),
      m_fast_bytes(128),
      m_num_parse_threads(0)
   {
      LZHAM_VERIFY( ((uint32_ptr)this & (LZHAM_GET_ALIGNMENT(lzcompressor) - 1)) == 0);

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_parse_thread_state); i++)
         m_parse_thread_state[i].set_malloc_context(malloc_context);
   }